

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O2

Option * getOptionPred(StringRef Name,size_t *Length,_func_bool_Option_ptr *Pred,
                      StringMap<llvm::cl::Option_*,_llvm::MallocAllocator> *OptionsMap)

{
  bool bVar1;
  const_iterator cVar2;
  StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
  SVar3;
  ulong uVar4;
  StringRef Key;
  
  uVar4 = Name.Length;
  while( true ) {
    Key.Length = uVar4;
    Key.Data = Name.Data;
    cVar2 = llvm::StringMap<llvm::cl::Option_*,_llvm::MallocAllocator>::find(OptionsMap,Key);
    SVar3.Ptr = (OptionsMap->super_StringMapImpl).TheTable +
                (OptionsMap->super_StringMapImpl).NumBuckets;
    if ((cVar2.
         super_StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
         .Ptr != (StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
                  )SVar3.Ptr) || (uVar4 < 2)) break;
    uVar4 = uVar4 - 1;
  }
  if ((cVar2.
       super_StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
       .Ptr != (StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
                )SVar3.Ptr) &&
     (bVar1 = (*Pred)(*(Option **)
                       (*(long *)cVar2.
                                 super_StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
                                 .Ptr + 8)), bVar1)) {
    *Length = uVar4;
    return *(Option **)
            (*(long *)cVar2.
                      super_StringMapIterBase<llvm::StringMapConstIterator<llvm::cl::Option_*>,_const_llvm::StringMapEntry<llvm::cl::Option_*>_>
                      .Ptr + 8);
  }
  return (Option *)0x0;
}

Assistant:

static Option *getOptionPred(StringRef Name, size_t &Length,
                             bool (*Pred)(const Option *),
                             const StringMap<Option *> &OptionsMap) {

  StringMap<Option *>::const_iterator OMI = OptionsMap.find(Name);

  // Loop while we haven't found an option and Name still has at least two
  // characters in it (so that the next iteration will not be the empty
  // string.
  while (OMI == OptionsMap.end() && Name.size() > 1) {
    Name = Name.substr(0, Name.size() - 1); // Chop off the last character.
    OMI = OptionsMap.find(Name);
  }

  if (OMI != OptionsMap.end() && Pred(OMI->second)) {
    Length = Name.size();
    return OMI->second; // Found one!
  }
  return nullptr; // No option found!
}